

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.h
# Opt level: O0

MatrixXd *
ChebTools::rootfinding::companion_matrix_transposed
          (MatrixXd *__return_storage_ptr__,ArrayXd *coeffs)

{
  Index IVar1;
  Scalar *pSVar2;
  CoeffReturnType pdVar3;
  int local_174;
  undefined1 local_170 [4];
  int j;
  double local_138;
  Type local_130;
  NegativeReturnType local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_b8;
  ConstantReturnType local_40;
  undefined1 local_21;
  long local_20;
  Index N;
  ArrayXd *coeffs_local;
  MatrixXd *A;
  
  N = (Index)coeffs;
  coeffs_local = (ArrayXd *)__return_storage_ptr__;
  IVar1 = Eigen::EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)coeffs);
  local_20 = IVar1 + -1;
  local_21 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(&local_40,local_20,local_20);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_40);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,0);
  *pSVar2 = 1.0;
  Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_130,(DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)N,local_20);
  Eigen::DenseBase<Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
  operator-(&local_f8,
            (DenseBase<Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
            &local_130);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)N,local_20);
  local_138 = *pdVar3 + *pdVar3;
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,-1,1,0,-1,1>const,-1,1,false>const>>
  ::operator/(&local_b8,
              (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>const,_1,1,false>const>>
               *)&local_f8,&local_138);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((ColXpr *)local_170,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
             local_20 + -1);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)local_170,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_b8);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,local_20 + -2,local_20 + -1);
  *pSVar2 = *pSVar2 + 0.5;
  for (local_174 = 1; (long)local_174 < local_20 + -1; local_174 = local_174 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,(long)(local_174 + -1),(long)local_174);
    *pSVar2 = 0.5;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,(long)(local_174 + 1),(long)local_174);
    *pSVar2 = 0.5;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Eigen::MatrixXd companion_matrix_transposed(const Eigen::ArrayXd &coeffs) {
    auto N = coeffs.size() - 1; // degree
    Eigen::MatrixXd A = Eigen::MatrixXd::Zero(N, N);
    // First col
    A(1, 0) = 1;
    // Last col
    A.col(N-1) = -coeffs.head(N)/(2.0*coeffs(N));
    A(N - 2, N - 1) += 0.5;
    // All the other cols
    for (int j = 1; j < N - 1; ++j) {
        A(j - 1, j) = 0.5;
        A(j + 1, j) = 0.5;
    }
    return A;
}